

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qatomic_cxx11.h
# Opt level: O0

bool QAtomicOps<int>::ref<int>(atomic<int> *_q_value)

{
  int iVar1;
  atomic<int> *_q_value_local;
  
  LOCK();
  iVar1 = (_q_value->super___atomic_base<int>)._M_i;
  (_q_value->super___atomic_base<int>)._M_i = (_q_value->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  return iVar1 != -1;
}

Assistant:

static inline bool ref(std::atomic<T> &_q_value)
    {
        /* Conceptually, we want to
         *    return ++_q_value != 0;
         * However, that would be sequentially consistent, and thus stronger
         * than what we need. Based on
         * http://eel.is/c++draft/atomics.types.memop#6, we know that
         * pre-increment is equivalent to fetch_add(1) + 1. Unlike
         * pre-increment, fetch_add takes a memory order argument, so we can get
         * the desired acquire-release semantics.
         * One last gotcha is that fetch_add(1) + 1 would need to be converted
         * back to T, because it's susceptible to integer promotion. To sidestep
         * this issue and to avoid UB on signed overflow, we rewrite the
         * expression to:
         */
        return _q_value.fetch_add(1, std::memory_order_acq_rel) != T(-1);
    }